

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void aom_highbd_var_filter_block2d_bil_first_pass
               (uint8_t *src_ptr8,uint16_t *output_ptr,uint src_pixels_per_line,int pixel_step,
               uint output_height,uint output_width,uint8_t *filter)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  lVar1 = (long)src_ptr8 * 2;
  for (uVar2 = 0; uVar2 != output_height; uVar2 = uVar2 + 1) {
    for (lVar3 = 0; (ulong)output_width * 2 != lVar3; lVar3 = lVar3 + 2) {
      *(short *)((long)output_ptr + lVar3) =
           (short)((uint)*filter * (uint)*(ushort *)(lVar1 + lVar3) +
                   (uint)filter[1] * (uint)*(ushort *)(lVar1 + (long)pixel_step * 2 + lVar3) + 0x40
                  >> 7);
    }
    lVar1 = lVar1 + (ulong)(src_pixels_per_line - output_width) * 2 + lVar3;
    output_ptr = output_ptr + output_width;
  }
  return;
}

Assistant:

void aom_highbd_var_filter_block2d_bil_first_pass(
    const uint8_t *src_ptr8, uint16_t *output_ptr,
    unsigned int src_pixels_per_line, int pixel_step,
    unsigned int output_height, unsigned int output_width,
    const uint8_t *filter) {
  unsigned int i, j;
  uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src_ptr8);
  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; ++j) {
      output_ptr[j] = ROUND_POWER_OF_TWO(
          (int)src_ptr[0] * filter[0] + (int)src_ptr[pixel_step] * filter[1],
          FILTER_BITS);

      ++src_ptr;
    }

    // Next row...
    src_ptr += src_pixels_per_line - output_width;
    output_ptr += output_width;
  }
}